

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# file.cpp
# Opt level: O1

SoundFont * __thiscall sf2cute::SoundFont::operator=(SoundFont *this,SoundFont *origin)

{
  vector<std::shared_ptr<sf2cute::SFInstrument>,_std::allocator<std::shared_ptr<sf2cute::SFInstrument>_>_>
  *this_00;
  vector<std::shared_ptr<sf2cute::SFSample>,_std::allocator<std::shared_ptr<sf2cute::SFSample>_>_>
  *this_01;
  pointer psVar1;
  pointer psVar2;
  pointer psVar3;
  SoundFont *pSVar4;
  SoundFont *this_02;
  shared_ptr<sf2cute::SFPreset> *preset;
  pointer psVar5;
  shared_ptr<sf2cute::SFInstrument> *instrument;
  pointer psVar6;
  pointer psVar7;
  undefined1 local_51;
  shared_ptr<sf2cute::SFInstrument> local_50;
  SoundFont *local_40;
  SoundFont *local_38;
  
  std::
  vector<std::shared_ptr<sf2cute::SFPreset>,_std::allocator<std::shared_ptr<sf2cute::SFPreset>_>_>::
  clear(&this->presets_);
  std::
  vector<std::shared_ptr<sf2cute::SFPreset>,_std::allocator<std::shared_ptr<sf2cute::SFPreset>_>_>::
  reserve(&this->presets_,
          (long)(origin->presets_).
                super__Vector_base<std::shared_ptr<sf2cute::SFPreset>,_std::allocator<std::shared_ptr<sf2cute::SFPreset>_>_>
                ._M_impl.super__Vector_impl_data._M_finish -
          (long)(origin->presets_).
                super__Vector_base<std::shared_ptr<sf2cute::SFPreset>,_std::allocator<std::shared_ptr<sf2cute::SFPreset>_>_>
                ._M_impl.super__Vector_impl_data._M_start >> 4);
  psVar5 = (origin->presets_).
           super__Vector_base<std::shared_ptr<sf2cute::SFPreset>,_std::allocator<std::shared_ptr<sf2cute::SFPreset>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  psVar1 = (origin->presets_).
           super__Vector_base<std::shared_ptr<sf2cute::SFPreset>,_std::allocator<std::shared_ptr<sf2cute::SFPreset>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  local_40 = origin;
  if (psVar5 != psVar1) {
    do {
      local_50.super___shared_ptr<sf2cute::SFInstrument,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
           (element_type *)0x0;
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
      __shared_count<sf2cute::SFPreset,std::allocator<sf2cute::SFPreset>,sf2cute::SFPreset&>
                (&local_50.super___shared_ptr<sf2cute::SFInstrument,_(__gnu_cxx::_Lock_policy)2>.
                  _M_refcount,(SFPreset **)&local_50,(allocator<sf2cute::SFPreset> *)&local_51,
                 (psVar5->super___shared_ptr<sf2cute::SFPreset,_(__gnu_cxx::_Lock_policy)2>)._M_ptr)
      ;
      std::
      vector<std::shared_ptr<sf2cute::SFPreset>,std::allocator<std::shared_ptr<sf2cute::SFPreset>>>
      ::emplace_back<std::shared_ptr<sf2cute::SFPreset>>
                ((vector<std::shared_ptr<sf2cute::SFPreset>,std::allocator<std::shared_ptr<sf2cute::SFPreset>>>
                  *)this,(shared_ptr<sf2cute::SFPreset> *)&local_50);
      if (local_50.super___shared_ptr<sf2cute::SFInstrument,_(__gnu_cxx::_Lock_policy)2>._M_refcount
          ._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  (local_50.super___shared_ptr<sf2cute::SFInstrument,_(__gnu_cxx::_Lock_policy)2>.
                   _M_refcount._M_pi);
      }
      psVar5 = psVar5 + 1;
    } while (psVar5 != psVar1);
  }
  this_00 = &this->instruments_;
  local_38 = this;
  std::
  vector<std::shared_ptr<sf2cute::SFInstrument>,_std::allocator<std::shared_ptr<sf2cute::SFInstrument>_>_>
  ::clear(this_00);
  pSVar4 = local_40;
  std::
  vector<std::shared_ptr<sf2cute::SFInstrument>,_std::allocator<std::shared_ptr<sf2cute::SFInstrument>_>_>
  ::reserve(this_00,(long)(local_40->instruments_).
                          super__Vector_base<std::shared_ptr<sf2cute::SFInstrument>,_std::allocator<std::shared_ptr<sf2cute::SFInstrument>_>_>
                          ._M_impl.super__Vector_impl_data._M_finish -
                    (long)(local_40->instruments_).
                          super__Vector_base<std::shared_ptr<sf2cute::SFInstrument>,_std::allocator<std::shared_ptr<sf2cute::SFInstrument>_>_>
                          ._M_impl.super__Vector_impl_data._M_start >> 4);
  psVar6 = (pSVar4->instruments_).
           super__Vector_base<std::shared_ptr<sf2cute::SFInstrument>,_std::allocator<std::shared_ptr<sf2cute::SFInstrument>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  psVar2 = (pSVar4->instruments_).
           super__Vector_base<std::shared_ptr<sf2cute::SFInstrument>,_std::allocator<std::shared_ptr<sf2cute::SFInstrument>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  if (psVar6 != psVar2) {
    do {
      local_50.super___shared_ptr<sf2cute::SFInstrument,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
           (element_type *)0x0;
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
      __shared_count<sf2cute::SFInstrument,std::allocator<sf2cute::SFInstrument>,sf2cute::SFInstrument&>
                (&local_50.super___shared_ptr<sf2cute::SFInstrument,_(__gnu_cxx::_Lock_policy)2>.
                  _M_refcount,(SFInstrument **)&local_50,
                 (allocator<sf2cute::SFInstrument> *)&local_51,
                 (psVar6->super___shared_ptr<sf2cute::SFInstrument,_(__gnu_cxx::_Lock_policy)2>).
                 _M_ptr);
      std::
      vector<std::shared_ptr<sf2cute::SFInstrument>,std::allocator<std::shared_ptr<sf2cute::SFInstrument>>>
      ::emplace_back<std::shared_ptr<sf2cute::SFInstrument>>
                ((vector<std::shared_ptr<sf2cute::SFInstrument>,std::allocator<std::shared_ptr<sf2cute::SFInstrument>>>
                  *)this_00,&local_50);
      if (local_50.super___shared_ptr<sf2cute::SFInstrument,_(__gnu_cxx::_Lock_policy)2>._M_refcount
          ._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  (local_50.super___shared_ptr<sf2cute::SFInstrument,_(__gnu_cxx::_Lock_policy)2>.
                   _M_refcount._M_pi);
      }
      psVar6 = psVar6 + 1;
    } while (psVar6 != psVar2);
  }
  this_01 = &local_38->samples_;
  std::
  vector<std::shared_ptr<sf2cute::SFSample>,_std::allocator<std::shared_ptr<sf2cute::SFSample>_>_>::
  clear(this_01);
  pSVar4 = local_40;
  std::
  vector<std::shared_ptr<sf2cute::SFSample>,_std::allocator<std::shared_ptr<sf2cute::SFSample>_>_>::
  reserve(this_01,(long)(local_40->samples_).
                        super__Vector_base<std::shared_ptr<sf2cute::SFSample>,_std::allocator<std::shared_ptr<sf2cute::SFSample>_>_>
                        ._M_impl.super__Vector_impl_data._M_finish -
                  (long)(local_40->samples_).
                        super__Vector_base<std::shared_ptr<sf2cute::SFSample>,_std::allocator<std::shared_ptr<sf2cute::SFSample>_>_>
                        ._M_impl.super__Vector_impl_data._M_start >> 4);
  psVar7 = (pSVar4->samples_).
           super__Vector_base<std::shared_ptr<sf2cute::SFSample>,_std::allocator<std::shared_ptr<sf2cute::SFSample>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  psVar3 = (pSVar4->samples_).
           super__Vector_base<std::shared_ptr<sf2cute::SFSample>,_std::allocator<std::shared_ptr<sf2cute::SFSample>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  if (psVar7 != psVar3) {
    do {
      local_50.super___shared_ptr<sf2cute::SFInstrument,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
           (element_type *)0x0;
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
      __shared_count<sf2cute::SFSample,std::allocator<sf2cute::SFSample>,sf2cute::SFSample&>
                (&local_50.super___shared_ptr<sf2cute::SFInstrument,_(__gnu_cxx::_Lock_policy)2>.
                  _M_refcount,(SFSample **)&local_50,(allocator<sf2cute::SFSample> *)&local_51,
                 (psVar7->super___shared_ptr<sf2cute::SFSample,_(__gnu_cxx::_Lock_policy)2>)._M_ptr)
      ;
      std::
      vector<std::shared_ptr<sf2cute::SFSample>,std::allocator<std::shared_ptr<sf2cute::SFSample>>>
      ::emplace_back<std::shared_ptr<sf2cute::SFSample>>
                ((vector<std::shared_ptr<sf2cute::SFSample>,std::allocator<std::shared_ptr<sf2cute::SFSample>>>
                  *)this_01,(shared_ptr<sf2cute::SFSample> *)&local_50);
      if (local_50.super___shared_ptr<sf2cute::SFInstrument,_(__gnu_cxx::_Lock_policy)2>._M_refcount
          ._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  (local_50.super___shared_ptr<sf2cute::SFInstrument,_(__gnu_cxx::_Lock_policy)2>.
                   _M_refcount._M_pi);
      }
      psVar7 = psVar7 + 1;
    } while (psVar7 != psVar3);
  }
  this_02 = local_38;
  pSVar4 = local_40;
  std::__cxx11::string::_M_assign((string *)&local_38->sound_engine_);
  std::__cxx11::string::_M_assign((string *)&this_02->bank_name_);
  std::__cxx11::string::_M_assign((string *)&this_02->rom_name_);
  this_02->rom_version_ = pSVar4->rom_version_;
  this_02->has_rom_version_ = pSVar4->has_rom_version_;
  std::__cxx11::string::_M_assign((string *)&this_02->creation_date_);
  std::__cxx11::string::_M_assign((string *)&this_02->engineers_);
  std::__cxx11::string::_M_assign((string *)&this_02->product_);
  std::__cxx11::string::_M_assign((string *)&this_02->copyright_);
  std::__cxx11::string::_M_assign((string *)&this_02->comment_);
  std::__cxx11::string::_M_assign((string *)&this_02->software_);
  SetBackwardReferences(this_02);
  RepairReferences(this_02,pSVar4);
  return this_02;
}

Assistant:

SoundFont & SoundFont::operator=(const SoundFont & origin) {
  // Copy presets.
  presets_.clear();
  presets_.reserve(origin.presets().size());
  for (const auto & preset : origin.presets()) {
    presets_.push_back(std::make_shared<SFPreset>(*preset));
  }

  // Copy instruments.
  instruments_.clear();
  instruments_.reserve(origin.instruments().size());
  for (const auto & instrument : origin.instruments()) {
    instruments_.push_back(std::make_shared<SFInstrument>(*instrument));
  }

  // Copy samples.
  samples_.clear();
  samples_.reserve(origin.samples().size());
  for (const auto & sample : origin.samples()) {
    samples_.push_back(std::make_shared<SFSample>(*sample));
  }

  // Copy other fields.
  sound_engine_ = origin.sound_engine_;
  bank_name_ = origin.bank_name_;
  rom_name_ = origin.rom_name_;
  rom_version_ = origin.rom_version_;
  has_rom_version_ = origin.has_rom_version_;
  creation_date_ = origin.creation_date_;
  engineers_ = origin.engineers_;
  product_ = origin.product_;
  copyright_ = origin.copyright_;
  comment_ = origin.comment_;
  software_ = origin.software_;

  // Repair references.
  SetBackwardReferences();
  RepairReferences(origin);

  return *this;
}